

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

int ImGuiStb::stb_text_locate_coord(ImGuiTextEditState *str,float x,float y)

{
  unsigned_short *puVar1;
  int iVar2;
  ImWchar *text;
  undefined1 in_R8B;
  int iVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  int local_50;
  ImWchar *local_38;
  
  iVar2 = str->CurLenW;
  if (iVar2 < 1) {
    return iVar2;
  }
  fVar8 = 0.0;
  uVar5 = 0;
  while( true ) {
    puVar1 = (str->Text).Data;
    local_38 = (ImWchar *)0x0;
    local_50 = (int)uVar5;
    IVar7 = InputTextCalcTextSizeW
                      (puVar1 + local_50,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,(bool)in_R8B)
    ;
    iVar3 = (int)((ulong)((long)local_38 - (long)(puVar1 + local_50)) >> 1);
    if (iVar3 < 1) {
      return iVar2;
    }
    if ((y < fVar8) && (local_50 == 0)) {
      return 0;
    }
    fVar8 = fVar8 + IVar7.y;
    if (y < fVar8) break;
    uVar5 = (ulong)(uint)(local_50 + iVar3);
    if (iVar2 <= local_50 + iVar3) {
      return iVar2;
    }
  }
  if (0.0 <= x) {
    if (x < IVar7.x) {
      uVar5 = (long)local_38 + (uVar5 * -2 - (long)puVar1);
      iVar4 = 0;
      iVar2 = 0;
      fVar8 = 0.0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH(str,local_50,iVar2);
        if (x < fVar8 + fVar6) {
          uVar5 = (ulong)(uint)(local_50 - iVar4);
          if (fVar8 + fVar6 * 0.5 <= x) {
            uVar5 = (ulong)((local_50 - iVar4) + 1);
          }
          goto LAB_00177a73;
        }
        iVar2 = iVar2 + 1;
        iVar4 = iVar4 + -1;
        fVar8 = fVar8 + fVar6;
      } while (-(int)(uVar5 >> 1) != iVar4);
    }
    local_50 = local_50 + iVar3;
    if (local_50 <= (str->Text).Size) {
      if ((str->Text).Data[(long)local_50 + -1] == 10) {
        local_50 = local_50 + -1;
      }
      return local_50;
    }
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                  ,0x38c,
                  "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                 );
  }
LAB_00177a73:
  return (int)uVar5;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}